

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void int_linear(vec<int> *a,vec<IntVar_*> *x,IntRelType t,int c,BoolView *r)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  IntRelType IVar5;
  int *piVar6;
  ulong uVar7;
  IntVar *pIVar8;
  IntVar *pIVar9;
  int c_00;
  double dVar10;
  BoolView local_70;
  BoolView local_60;
  BoolView local_50;
  BoolView local_40;
  
  c_00 = -c;
  iVar4 = c;
  if (c < 1) {
    iVar4 = c_00;
  }
  dVar10 = (double)iVar4;
  uVar1 = x->sz;
  bVar2 = false;
  for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
    bVar3 = true;
    if (a->data[uVar7] == -1) {
      bVar3 = bVar2;
    }
    if (a->data[uVar7] == 1) {
      bVar3 = bVar2;
    }
    bVar2 = bVar3;
    dVar10 = dVar10 + 2147483647.0;
  }
  if (9.223372036854776e+18 <= dVar10) {
    fprintf(_stderr,"%s:%d: ","linear.cpp",0x1d4);
    fwrite("Linear constraint may overflow, not yet supported\n",0x32,1,_stderr);
    abort();
  }
  if ((ulong)uVar1 == 2) {
    if (!bVar2) {
      bVar3 = BoolView::isTrue(r);
      piVar6 = a->data;
      iVar4 = *piVar6;
      if (bVar3) {
        if (iVar4 == 1) {
          if (piVar6[1] == -1) {
            pIVar9 = *x->data;
            pIVar8 = x->data[1];
LAB_00185c3a:
            int_rel(pIVar9,t,pIVar8,c);
            return;
          }
          if (t != IRT_NE && piVar6[1] == 1) {
            pIVar8 = *x->data;
            pIVar9 = x->data[1];
            goto LAB_00185c06;
          }
        }
        else if (iVar4 == -1) {
          if (t != IRT_NE && piVar6[1] == -1) {
            pIVar8 = *x->data;
            pIVar9 = x->data[1];
            t = operator-(t);
            c = c_00;
LAB_00185c06:
            bin_linear(pIVar8,pIVar9,t,c);
            return;
          }
          if (piVar6[1] == 1) {
            pIVar8 = *x->data;
            pIVar9 = x->data[1];
            goto LAB_00185c3a;
          }
        }
      }
      else if (iVar4 + piVar6[1] == 0) {
        if (piVar6[1] == -1 && iVar4 == 1) {
          int_rel_reif(*x->data,t,x->data[1],r,c);
          piVar6 = a->data;
          iVar4 = *piVar6;
        }
        if (iVar4 != -1) {
          return;
        }
        if (piVar6[1] != 1) {
          return;
        }
        int_rel_reif(x->data[1],t,*x->data,r,c);
        return;
      }
    }
  }
  else if ((uVar1 == 1) && (!bVar2)) {
    bVar2 = BoolView::isTrue(r);
    iVar4 = *a->data;
    if (!bVar2) {
      if (iVar4 == 1) {
        local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
        local_40.v = r->v;
        local_40.s = r->s;
        int_rel_reif(*x->data,t,c,&local_40);
        iVar4 = *a->data;
      }
      if (iVar4 != -1) {
        return;
      }
      pIVar8 = *x->data;
      IVar5 = operator-(t);
      local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_50.v = r->v;
      local_50.s = r->s;
      int_rel_reif(pIVar8,IVar5,c_00,&local_50);
      return;
    }
    if (iVar4 == 1) {
      int_rel(*x->data,t,c);
      iVar4 = *a->data;
    }
    if (iVar4 != -1) {
      return;
    }
    pIVar8 = *x->data;
    IVar5 = operator-(t);
    int_rel(pIVar8,IVar5,c_00);
    return;
  }
  bVar3 = BoolView::isTrue(r);
  if (!bVar3) {
    if (bVar2) {
      local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_60.v = r->v;
      local_60.s = r->s;
      int_linear_reif<1>(a,x,t,c,&local_60);
    }
    else {
      local_70.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_70.v = r->v;
      local_70.s = r->s;
      int_linear_reif<0>(a,x,t,c,&local_70);
    }
    return;
  }
  if (!bVar2) {
    int_linear<0>(a,x,t,c);
    return;
  }
  int_linear<1>(a,x,t,c);
  return;
}

Assistant:

void int_linear(vec<int>& a, vec<IntVar*>& x, IntRelType t, int c, const BoolView& r) {
	assert(a.size() == x.size());

	bool scale = false;
	double limit = abs(c);
	for (unsigned int i = 0; i < x.size(); i++) {
		assert(a[i]);
		if (a[i] != 1 && a[i] != -1) {
			scale = true;
		}
		limit += abs(a[i]) * IntVar::max_limit + INT_MAX;
	}
	if (limit >= INT64_MAX) {
		CHUFFED_ERROR("Linear constraint may overflow, not yet supported\n");
	}

	if (x.size() == 1 && !scale) {
		if (r.isTrue()) {
			if (a[0] == 1) {
				int_rel(x[0], t, c);
			}
			if (a[0] == -1) {
				int_rel(x[0], -t, -c);
			}
		} else {
			if (a[0] == 1) {
				int_rel_reif(x[0], t, c, r);
			}
			if (a[0] == -1) {
				int_rel_reif(x[0], -t, -c, r);
			}
		}
		return;
	}

	if (x.size() == 2 && !scale) {
		if (r.isTrue()) {
			if (a[0] == -1 && a[1] == -1 && t != IRT_NE) {
				bin_linear(x[0], x[1], -t, -c);
				return;
			}
			if (a[0] == 1 && a[1] == -1) {
				int_rel(x[0], t, x[1], c);
				return;
			}
			if (a[0] == -1 && a[1] == 1) {
				int_rel(x[1], t, x[0], c);
				return;
			}
			if (a[0] == 1 && a[1] == 1 && t != IRT_NE) {
				bin_linear(x[0], x[1], t, c);
				return;
			}
		} else if (a[0] + a[1] == 0) {
			if (a[0] == 1 && a[1] == -1) {
				int_rel_reif(x[0], t, x[1], r, c);
			}
			if (a[0] == -1 && a[1] == 1) {
				int_rel_reif(x[1], t, x[0], r, c);
			}
			return;
		}
	}

	if (r.isTrue()) {
		if (scale) {
			int_linear<1>(a, x, t, c);
		} else {
			int_linear<0>(a, x, t, c);
		}
	} else {
		if (scale) {
			int_linear_reif<1>(a, x, t, c, r);
		} else {
			int_linear_reif<0>(a, x, t, c, r);
		}
	}
}